

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O1

void __thiscall
v_hashmap<substring,_features_*>::put_after_get
          (v_hashmap<substring,_features_*> *this,substring *key,uint64_t hash,features **val)

{
  undefined8 *puVar1;
  long lVar2;
  char *pcVar3;
  
  if ((*(char *)(*(long *)(this + 0x18) + *(long *)(this + 0x38) * 0x28) == '\0') &&
     (lVar2 = *(long *)(this + 0x40), *(long *)(this + 0x40) = lVar2 + 1,
     (ulong)((*(long *)(this + 0x28) - *(long *)(this + 0x18) >> 3) * -0x3333333333333333) <=
     lVar2 * 4 + 4U)) {
    double_size(this);
    get(this,key,hash);
  }
  *(undefined1 *)(*(long *)(this + 0x18) + *(long *)(this + 0x38) * 0x28) = 1;
  pcVar3 = key->end;
  puVar1 = (undefined8 *)(*(long *)(this + 0x18) + 8 + *(long *)(this + 0x38) * 0x28);
  *puVar1 = key->begin;
  puVar1[1] = pcVar3;
  *(features **)(*(long *)(this + 0x18) + 0x18 + *(long *)(this + 0x38) * 0x28) = *val;
  *(uint64_t *)(*(long *)(this + 0x18) + 0x20 + *(long *)(this + 0x38) * 0x28) = hash;
  return;
}

Assistant:

void put_after_get(const K& key, uint64_t hash, const V& val)
  {
    if (!dat[last_position].occupied)
    {
      num_occupants++;
      if (num_occupants * 4 >= base_size())  // grow when we're a quarter full
      {
        double_size();
        get(key, hash);  // probably should change last_position-- this is the lazy man's way to do it
      }
    }

    // now actually insert it
    put_after_get_nogrow(key, hash, val);
  }